

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_case::translate
          (method_case *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  compiler_type *this_00;
  _Elt_pointer pdVar2;
  size_t line;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  statement_case *this_01;
  _Elt_pointer pptVar6;
  exception *this_02;
  reference pvVar7;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *ast;
  allocator_type local_199;
  string local_198;
  string local_178;
  string local_158;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_e8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_98;
  _Self local_78;
  _Self local_50;
  
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar4;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 7) {
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
              (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
    ;
    this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_78._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_first;
    local_78._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_78._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_node;
    std::operator+(&local_50,&local_78,1);
    local_98._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_98._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_98._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_98._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::
    deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)&local_e8,&local_50,&local_98,&local_199);
    ast = &local_e8;
    compiler_type::translate(this_00,ast,&body);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque(&local_e8);
    this_01 = (statement_case *)statement_base::operator_new((statement_base *)0x30,(size_t)ast);
    local_e8.
    super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)ptVar1[1]._vptr_token_base;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_e8);
    pdVar2 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar6 ==
        (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_case::statement_case(this_01,(var *)(*pptVar5 + 1),&body,context,pptVar6[-1]);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
    ;
    return &this_01->super_statement_base;
  }
  pdVar2 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar6 ==
      (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  line = pptVar6[-1]->line_num;
  this_02 = (exception *)__cxa_allocate_exception(0x90);
  std::__cxx11::string::string
            ((string *)&local_158,
             (string *)
             &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              file_path);
  pvVar7 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->file_buff,line - 1);
  std::__cxx11::string::string((string *)&local_178,(string *)pvVar7);
  std::__cxx11::string::string
            ((string *)&local_198,"Case Tag must be a constant value.",(allocator *)&body);
  exception::exception(this_02,line,&local_158,&local_178,&local_198);
  __cxa_throw(this_02,&exception::typeinfo,exception::~exception);
}

Assistant:

statement_base *method_case::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data()->get_type() != token_types::value) {
			std::size_t line_num = static_cast<token_endline *>(raw.front().back())->get_line_num();
			const char *what = "Case Tag must be a constant value.";
			throw exception(line_num, context->file_path, context->file_buff.at(line_num - 1), what);
		}
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_case(static_cast<token_value *>(tree.root().data())->get_value(), body, context,
		                          raw.front().back());
	}